

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolverAPI.c
# Opt level: O1

int xSAT_SolverAddClause(xSAT_Solver_t *s,Vec_Int_t *vLits)

{
  char cVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  size_t __nmemb;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  
  __nmemb = (size_t)vLits->nSize;
  qsort(vLits->pArray,__nmemb,4,Vec_IntSortCompare1);
  if ((long)vLits->nSize < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
  }
  iVar2 = vLits->pArray[(long)vLits->nSize + -1];
  while (s->vActivity->nSize <= iVar2 >> 1) {
    xSAT_SolverAddVariable(s,(int)__nmemb);
  }
  uVar4 = vLits->nSize;
  uVar7 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar5 = 0;
  }
  else {
    piVar3 = vLits->pArray;
    lVar6 = 0;
    uVar8 = 0xfffffffe;
    uVar5 = 0;
    do {
      uVar4 = piVar3[lVar6];
      if ((uVar4 ^ uVar8) == 1) {
        return 1;
      }
      uVar9 = (int)uVar4 >> 1;
      if (((int)uVar9 < 0) || (s->vAssigns->nSize <= (int)uVar9)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      cVar1 = s->vAssigns->pArray[uVar9];
      if ((uVar4 & 1) == (int)cVar1) {
        return 1;
      }
      if ((uVar4 != uVar8) && (cVar1 == '\x03')) {
        if (((int)uVar5 < 0) || ((int)uVar7 <= (int)uVar5)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        uVar7 = (ulong)uVar5;
        uVar5 = uVar5 + 1;
        piVar3[uVar7] = uVar4;
        uVar8 = uVar4;
      }
      lVar6 = lVar6 + 1;
      uVar4 = vLits->nSize;
      uVar7 = (ulong)(int)uVar4;
    } while (lVar6 < (long)uVar7);
  }
  if ((int)uVar5 <= (int)uVar4) {
    vLits->nSize = uVar5;
    if (uVar5 == 0) {
      uVar4 = 0;
    }
    else if (uVar5 == 1) {
      xSAT_SolverEnqueue(s,*vLits->pArray,0xffffffff);
      uVar4 = xSAT_SolverPropagate(s);
      uVar4 = (uint)(uVar4 == 0xffffffff);
    }
    else {
      xSAT_SolverClaNew(s,vLits,0);
      uVar4 = 1;
    }
    return uVar4;
  }
  __assert_fail("p->nSize >= nSizeNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
}

Assistant:

int xSAT_SolverAddClause( xSAT_Solver_t * s, Vec_Int_t * vLits )
{
    int i, j;
    int Lit, PrevLit;
    int MaxVar;

    Vec_IntSort( vLits, 0 );
    MaxVar = xSAT_Lit2Var( Vec_IntEntryLast( vLits ) );
    while ( MaxVar >= Vec_IntSize( s->vActivity ) )
        xSAT_SolverAddVariable( s, 1 );

    j = 0;
    PrevLit = LitUndef;
    Vec_IntForEachEntry( vLits, Lit, i )
    {
        if ( Lit == xSAT_NegLit( PrevLit ) || Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( Lit ) ) == xSAT_LitSign( Lit ) )
            return true;
        else if ( Lit != PrevLit && Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( Lit ) ) == VarX )
        {
            PrevLit = Lit;
            Vec_IntWriteEntry( vLits, j++, Lit );
        }
    }
    Vec_IntShrink( vLits, j );

    if ( Vec_IntSize( vLits ) == 0 )
        return false;
    if ( Vec_IntSize( vLits ) == 1 )
    {
        xSAT_SolverEnqueue( s, Vec_IntEntry( vLits, 0 ), CRefUndef );
        return ( xSAT_SolverPropagate( s ) == CRefUndef );
    }

    xSAT_SolverClaNew( s, vLits, 0 );
    return true;
}